

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int DoGetCVar(FBaseCVar *cvar,bool is_string)

{
  int iVar1;
  float fVar2;
  undefined4 extraout_var;
  
  if (cvar == (FBaseCVar *)0x0) {
    iVar1 = 0;
  }
  else {
    if (is_string) {
      iVar1 = (*cvar->_vptr_FBaseCVar[4])(cvar,3);
      iVar1 = ACSStringPool::AddString(&GlobalACSStrings,(char *)CONCAT44(extraout_var,iVar1));
      return iVar1;
    }
    iVar1 = (*cvar->_vptr_FBaseCVar[2])(cvar);
    if (iVar1 == 2) {
      fVar2 = (float)(*cvar->_vptr_FBaseCVar[4])(cvar,2);
      iVar1 = SUB84((double)fVar2 + 103079215104.0,0);
    }
    else {
      iVar1 = (*cvar->_vptr_FBaseCVar[4])(cvar,1);
    }
  }
  return iVar1;
}

Assistant:

static int DoGetCVar(FBaseCVar *cvar, bool is_string)
{
	UCVarValue val;

	if (cvar == nullptr)
	{
		return 0;
	}
	else if (is_string)
	{
		val = cvar->GetGenericRep(CVAR_String);
		return GlobalACSStrings.AddString(val.String);
	}
	else if (cvar->GetRealType() == CVAR_Float)
	{
		val = cvar->GetGenericRep(CVAR_Float);
		return DoubleToACS(val.Float);
	}
	else
	{
		val = cvar->GetGenericRep(CVAR_Int);
		return val.Int;
	}
}